

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Client __thiscall capnp::Capability::Server::thisCap(Server *this)

{
  ClientHook **ppCVar1;
  ClientHook *extraout_RDX;
  long in_RSI;
  Client CVar2;
  Own<capnp::ClientHook,_std::nullptr_t> local_58;
  ClientHook *local_48;
  Fault local_30;
  ClientHook *local_28;
  ClientHook *_kj_result;
  ClientHook *hook;
  Server *this_local;
  
  this_local = this;
  local_28 = kj::_::readMaybe<capnp::ClientHook>((Maybe<capnp::ClientHook_&> *)(in_RSI + 8));
  if (local_28 != (ClientHook *)0x0) {
    ppCVar1 = kj::mv<capnp::ClientHook*>(&local_28);
    local_48 = *ppCVar1;
    _kj_result = local_48;
    (*local_48->_vptr_ClientHook[4])();
    Capability::Client::Client((Client *)this,&local_58);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&local_58);
    CVar2.hook.ptr = extraout_RDX;
    CVar2.hook.disposer = (Disposer *)this;
    return (Client)CVar2.hook;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[74]>
            (&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
             ,0x381,FAILED,"thisHook != nullptr",
             "\"can\'t call thisCap() when no Clients are currently pointing at the object\"",
             (char (*) [74])
             "can\'t call thisCap() when no Clients are currently pointing at the object");
  kj::_::Debug::Fault::fatal(&local_30);
}

Assistant:

Capability::Client Capability::Server::thisCap() {
  auto& hook = KJ_REQUIRE_NONNULL(thisHook,
      "can't call thisCap() when no Clients are currently pointing at the object");
  return Client(hook.addRef());
}